

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O3

_Bool effect_do(effect *effect,source origin,object *obj,_Bool *ident,_Bool aware,wchar_t dir,
               wchar_t beam,wchar_t boost,command *cmd)

{
  _Bool _Var1;
  short sVar2;
  wchar_t wVar3;
  uint uVar4;
  wchar_t wVar5;
  _Bool _Var6;
  int iVar7;
  bool bVar8;
  random_value_conflict local_c8;
  anon_union_8_4_b62eeb40_for_which_conflict local_b0;
  object *local_a8;
  effect_handler_context_t local_a0;
  
  local_b0 = origin.which;
  local_c8.base = L'\0';
  local_c8.dice = L'\0';
  local_c8.sides = L'\0';
  local_c8.m_bonus = L'\0';
  _Var6 = false;
  local_a8 = obj;
  do {
    if ((effect == (effect *)0x0) ||
       (uVar4 = *(uint *)&effect->index, 0x6f < (ushort)((short)uVar4 - 1U))) {
      msg("Bad effect passed to effect_do(). Please report this bug.");
      return false;
    }
    if (effect->dice == (dice_t *)0x0) {
      wVar3 = L'\0';
    }
    else {
      wVar3 = dice_roll(effect->dice,(random_value *)&local_c8);
      uVar4 = (uint)effect->index;
    }
    sVar2 = (short)uVar4;
    if ((sVar2 == 0x6c) || (iVar7 = 1, (uVar4 & 0xffff) == 1)) {
      if (L'\0' < wVar3) {
        if ((wVar3 == L'\x01' || origin.what != SRC_PLAYER) || sVar2 == 1) {
          local_a0.effect = Rand_div(wVar3);
          wVar5 = local_a0.effect;
        }
        else {
          if (sVar2 != 0x6c) {
            __assert_fail("effect->index == EF_SELECT && origin.what == SRC_PLAYER",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                          ,0x1af,
                          "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                         );
          }
          *ident = true;
          if (cmd == (command *)0x0) {
            local_a0.effect = get_effect_from_list((char *)0x0,effect->next,wVar3,true);
            if (local_a0.effect == L'\xffffffff') {
              return false;
            }
          }
          else {
            wVar5 = cmd_get_effect_from_list
                              ((command_conflict *)cmd,"list_index",(int *)&local_a0,(char *)0x0,
                               effect->next,wVar3,true);
            if (wVar5 != L'\0') {
              return false;
            }
          }
          if (local_a0.effect == L'\xfffffffe') {
            local_a0.effect = Rand_div(wVar3);
          }
          if (((int)local_a0.effect < L'\0') ||
             (wVar5 = local_a0.effect, wVar3 <= (int)local_a0.effect)) {
            __assert_fail("choice >= 0 && choice < choice_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                          ,0x1cc,
                          "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                         );
          }
        }
        do {
          effect = effect->next;
          bVar8 = local_a0.effect == L'\0';
          local_a0.effect = local_a0.effect + L'\xffffffff';
          if (bVar8) break;
        } while (effect != (effect *)0x0);
        if (effect == (effect *)0x0) {
          return true;
        }
        if (effect->dice != (dice_t *)0x0) {
          dice_roll(effect->dice,(random_value *)&local_c8);
        }
        iVar7 = wVar3 - wVar5;
        uVar4 = (uint)effect->index;
        goto LAB_00141d3a;
      }
      effect = effect->next;
      _Var6 = true;
    }
    else {
LAB_00141d3a:
      if ((short)uVar4 != 0) {
        wVar3 = uVar4 & 0xffff;
        if (wVar3 != L'q') {
          local_a0.origin.which = local_b0;
          local_a0.obj = local_a8;
          local_a0.dir = dir;
          local_a0.beam = beam;
          local_a0.boost = boost;
          local_a0.value.base = local_c8.base;
          local_a0.value.dice = local_c8.dice;
          local_a0.value.sides = local_c8.sides;
          local_a0.value.m_bonus = local_c8.m_bonus;
          local_a0.subtype = effect->subtype;
          local_a0.y = effect->y;
          local_a0.x = effect->x;
          local_a0.radius = effect->radius;
          local_a0.other = effect->other;
          local_a0.msg = effect->msg;
          local_a0.ident = *ident;
          local_a0.cmd = cmd;
          local_a0.effect = wVar3;
          local_a0.origin.what = origin.what;
          local_a0.aware = aware;
          _Var1 = (*effects[(uint)wVar3].handler)(&local_a0);
          _Var6 = (_Bool)(_Var6 | _Var1);
          *ident = local_a0.ident;
        }
      }
      if (iVar7 != 0) {
        do {
          iVar7 = iVar7 + -1;
          effect = effect->next;
          if (iVar7 == 0) break;
        } while (effect != (effect *)0x0);
      }
    }
    if (effect == (effect *)0x0) {
      return _Var6;
    }
  } while( true );
}

Assistant:

bool effect_do(struct effect *effect,
		struct source origin,
		struct object *obj,
		bool *ident,
		bool aware,
		int dir,
		int beam,
		int boost,
		struct command *cmd)
{
	bool completed = false;
	effect_handler_f handler;
	random_value value = { 0, 0, 0, 0 };

	do {
		int choice_count = 0, leftover = 1;

		if (!effect_valid(effect)) {
			msg("Bad effect passed to effect_do(). Please report this bug.");
			return false;
		}

		if (effect->dice != NULL)
			choice_count = dice_roll(effect->dice, &value);

		/* Deal with special random and select effects */
		if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
			int choice;

			/*
			 * If it has no subeffects, act as if it completed
			 * successfully and go to the next effect.
			 */
			if (choice_count <= 0) {
				completed = true;
				effect = effect->next;
				continue;
			}

			/*
			 * Treat select effects like random ones if they
			 * aren't from a player or if there's really no choice
			 * to be made.
			 */
			if (effect->index == EF_RANDOM ||
					origin.what != SRC_PLAYER ||
					choice_count < 2) {
				choice = randint0(choice_count);
			} else {
				assert(effect->index == EF_SELECT &&
					origin.what == SRC_PLAYER);
				/*
				 * Since a choice is presented, allow
				 * identification, even if no choice is made.
				 */
				*ident = true;
				if (cmd) {
					if (cmd_get_effect_from_list(cmd,
							"list_index",
							&choice, NULL,
							effect->next,
							choice_count,
							true) != CMD_OK) {
						return false;
					}
				} else {
					choice = get_effect_from_list(NULL,
						effect->next, choice_count,
						true);
					if (choice == -1) return false;
				}

				/*
				 * If the player chose to use a random effect,
				 * roll for it.
				 */
				if (choice == -2) {
					choice = randint0(choice_count);
				}
				assert(choice >= 0 && choice < choice_count);
			}

			leftover = choice_count - choice;

			/* Skip to the chosen effect */
			effect = effect->next;
			while (choice-- && effect)
				effect = effect->next;
			if (!effect) {
				/*
				 * There's fewer subeffects than expected.  Act
				 * as if it ran successfully.
				 */
				completed = true;
				break;
			}

			/* Roll the damage, if needed */
			if (effect->dice != NULL)
				(void) dice_roll(effect->dice, &value);
		}

		/* Handle the effect */
		handler = effects[effect->index].handler;
		if (handler != NULL) {
			effect_handler_context_t context = {
				effect->index,
				origin,
				obj,
				aware,
				dir,
				beam,
				boost,
				value,
				effect->subtype,
				effect->radius,
				effect->other,
				effect->y,
				effect->x,
				effect->msg,
				*ident,
				cmd
			};

			completed = handler(&context) || completed;
			*ident = context.ident;
		}

		/* Get the next effect, if there is one */
		while (leftover-- && effect)
			effect = effect->next;
	} while (effect);

	return completed;
}